

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendsig.c
# Opt level: O0

void duh_sigrenderer_set_analyser_callback
               (DUH_SIGRENDERER *sigrenderer,DUH_SIGRENDERER_ANALYSER_CALLBACK callback,void *data)

{
  fprintf(_stderr,
          "Call to deprecated function duh_sigrenderer_set_analyser_callback(). The\ncallback was not installed. See dumb/docs/deprec.txt for how to fix this.\n"
         );
  return;
}

Assistant:

void duh_sigrenderer_set_analyser_callback(
	DUH_SIGRENDERER *sigrenderer,
	DUH_SIGRENDERER_ANALYSER_CALLBACK callback, void *data
)
{
	(void)sigrenderer;
	(void)callback;
	(void)data;
	fprintf(stderr,
		"Call to deprecated function duh_sigrenderer_set_analyser_callback(). The\n"
		"callback was not installed. See dumb/docs/deprec.txt for how to fix this.\n");
}